

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

int __thiscall embree::FileStream::next(FileStream *this)

{
  int iVar1;
  
  iVar1 = std::istream::get();
  if (iVar1 != 0xd) {
    if (iVar1 == 10) {
      this->lineNumber = this->lineNumber + 1;
      this->colNumber = 0;
    }
    else {
      this->colNumber = this->colNumber + 1;
    }
  }
  this->charNumber = this->charNumber + 1;
  return iVar1;
}

Assistant:

int next() {
      int c = ifs.get();
      if (c == '\n') { lineNumber++; colNumber = 0; } else if (c != '\r') colNumber++;
      charNumber++;
      return c;
    }